

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
HdlcSimulationDataGenerator::GenControlField
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          HdlcSimulationDataGenerator *this,HdlcFrameType frameType,HdlcControlType controlType,
          U8 value)

{
  byte local_23 [3];
  HdlcControlType local_20;
  U8 ctrl;
  HdlcFrameType HStack_1c;
  U8 value_local;
  HdlcControlType controlType_local;
  HdlcFrameType frameType_local;
  HdlcSimulationDataGenerator *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *controlRet;
  
  local_23[1] = 0;
  local_23[2] = value;
  local_20 = controlType;
  HStack_1c = frameType;
  _controlType_local = this;
  this_local = (HdlcSimulationDataGenerator *)__return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  if (HStack_1c == HDLC_I_FRAME) {
    local_23[0] = local_23[2] & 0xfe | (byte)HStack_1c;
  }
  else if (HStack_1c == HDLC_S_FRAME) {
    local_23[0] = local_23[2] & 0xfc | (byte)HStack_1c;
  }
  else if (HStack_1c == HDLC_U_FRAME) {
    local_23[0] = local_23[2] | 3;
  }
  if (HStack_1c < 2) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,local_23);
    if (local_20 == HDLC_EXTENDED_CONTROL_FIELD_MOD_128) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,local_23 + 2);
    }
    else if (local_20 == HDLC_EXTENDED_CONTROL_FIELD_MOD_32768) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,local_23 + 2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,local_23 + 2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,local_23 + 2);
    }
    else if (local_20 == HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,local_23 + 2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,local_23 + 2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,local_23 + 2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,local_23 + 2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,local_23 + 2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,local_23 + 2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,local_23 + 2);
    }
  }
  else if (HStack_1c == HDLC_U_FRAME) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,local_23);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::GenControlField( HdlcFrameType frameType, HdlcControlType controlType, U8 value ) const
{
    vector<U8> controlRet;
    U8 ctrl;
    switch( frameType )
    {
    case HDLC_I_FRAME:
        ctrl = ( value & 0xFE ) | U8( frameType );
        break;
    case HDLC_S_FRAME:
        ctrl = ( value & 0xFC ) | U8( frameType );
        break;
    case HDLC_U_FRAME:
        ctrl = value | U8( HDLC_U_FRAME );
    }

    switch( frameType )
    {
    case HDLC_I_FRAME:
    case HDLC_S_FRAME:
    {
        // first byte
        controlRet.push_back( ctrl );
        switch( controlType )
        {
        case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
            controlRet.push_back( value ); // second byte
            break;
        case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
            controlRet.push_back( value ); // second byte
            controlRet.push_back( value ); // third byte
            controlRet.push_back( value ); // fourth byte
            break;
        case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
            controlRet.push_back( value ); // second byte
            controlRet.push_back( value ); // third byte
            controlRet.push_back( value ); // fourth byte
            controlRet.push_back( value ); // fifth byte
            controlRet.push_back( value ); // sixth byte
            controlRet.push_back( value ); // seventh byte
            controlRet.push_back( value ); // eighth byte
            break;
        }
        break;
    }
    case HDLC_U_FRAME: // U frames are always of 8 bits
    {
        controlRet.push_back( ctrl );
        break;
    }
    }
    return controlRet;
}